

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError MuxImageDeleteNth(WebPMuxImage **wpi_list,uint32_t nth)

{
  int iVar1;
  WebPMuxImage *pWVar2;
  WebPMuxImage *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = SearchImageToGetOrDelete
                    (wpi_list,nth,
                     (WebPMuxImage ***)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                    );
  if (iVar1 != 0) {
    pWVar2 = MuxImageDelete(in_RDI);
    in_RDI->header = (WebPChunk *)pWVar2;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

WebPMuxError MuxImageDeleteNth(WebPMuxImage** wpi_list, uint32_t nth) {
  assert(wpi_list);
  if (!SearchImageToGetOrDelete(wpi_list, nth, &wpi_list)) {
    return WEBP_MUX_NOT_FOUND;
  }
  *wpi_list = MuxImageDelete(*wpi_list);
  return WEBP_MUX_OK;
}